

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O1

void njoy::ENDFtk::section::Type<28>::SubshellData::verifySize(int NPL,int NTR)

{
  undefined8 *puVar1;
  
  if (NTR * 6 + 6 == NPL) {
    return;
  }
  tools::Log::error<char_const*>("Encountered illegal NPL and NTR values ");
  tools::Log::info<char_const*>("NPL must be equal to 6*NTR+6 for fission yield data");
  tools::Log::info<char_const*,int>("NPL value: {}",NPL);
  tools::Log::info<char_const*,int>("NTR value: {}",NTR);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NPL, int NTR ) {

  if ( NPL != ( NTR + 1 ) * 6 ) {

    Log::error( "Encountered illegal NPL and NTR values " );
    Log::info( "NPL must be equal to 6*NTR+6 for fission yield data" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NTR value: {}", NTR );
    throw std::exception();
  }
}